

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SubscribeToCommands
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,
          IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC commandCallback,void *userContextCallback)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  _Bool unsubscribing;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  IOTHUB_CLIENT_RESULT result;
  void *userContextCallback_local;
  IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC commandCallback_local;
  IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle_local;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    l._4_4_ = IOTHUB_CLIENT_INVALID_ARG;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar3 = IOTHUB_CLIENT_RESULTStrings(IOTHUB_CLIENT_INVALID_ARG);
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SubscribeToCommands",0xa79,1,"result = %s",pcVar3);
    }
  }
  else {
    l._4_4_ = VerifyMethodCallbackType
                        (iotHubClientHandle,CALLBACK_TYPE_COMMAND,
                         commandCallback == (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0);
    if (l._4_4_ == IOTHUB_CLIENT_OK) {
      if (commandCallback == (IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC)0x0) {
        (*iotHubClientHandle->IoTHubTransport_Unsubscribe_DeviceMethod)
                  (iotHubClientHandle->deviceHandle);
        ResetMethodCallbackData(iotHubClientHandle);
        l._4_4_ = IOTHUB_CLIENT_OK;
      }
      else {
        iVar1 = (*iotHubClientHandle->IoTHubTransport_Subscribe_DeviceMethod)
                          (iotHubClientHandle->deviceHandle);
        if (iVar1 == 0) {
          (iotHubClientHandle->methodCallback).type = CALLBACK_TYPE_COMMAND;
          (iotHubClientHandle->methodCallback).commandCallback = commandCallback;
          (iotHubClientHandle->methodCallback).userContextCallback = userContextCallback;
          l._4_4_ = IOTHUB_CLIENT_OK;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                      ,"IoTHubClientCore_LL_SubscribeToCommands",0xa95,1,
                      "IoTHubTransport_Subscribe_DeviceMethod failed");
          }
          ResetMethodCallbackData(iotHubClientHandle);
          l._4_4_ = IOTHUB_CLIENT_ERROR;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"IoTHubClientCore_LL_SubscribeToCommands",0xa82,1,"Incorrect callback type");
      }
    }
  }
  return l._4_4_;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SubscribeToCommands(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_CLIENT_COMMAND_CALLBACK_ASYNC commandCallback, void* userContextCallback)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        result = IOTHUB_CLIENT_INVALID_ARG;
        LOG_ERROR_RESULT;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        bool unsubscribing = (commandCallback == NULL);

        if ((result = VerifyMethodCallbackType(handleData, CALLBACK_TYPE_COMMAND, unsubscribing)) != IOTHUB_CLIENT_OK)
        {
            LogInfo("Incorrect callback type");
        }
        else if (unsubscribing)
        {
            handleData->IoTHubTransport_Unsubscribe_DeviceMethod(handleData->deviceHandle);
            ResetMethodCallbackData(handleData);
            result = IOTHUB_CLIENT_OK;
        }
        else
        {
            if (handleData->IoTHubTransport_Subscribe_DeviceMethod(handleData->deviceHandle) == 0)
            {
                handleData->methodCallback.type = CALLBACK_TYPE_COMMAND;
                handleData->methodCallback.commandCallback = commandCallback;
                handleData->methodCallback.userContextCallback = userContextCallback;
                result = IOTHUB_CLIENT_OK;
            }
            else
            {
                LogError("IoTHubTransport_Subscribe_DeviceMethod failed");
                ResetMethodCallbackData(handleData);
                result = IOTHUB_CLIENT_ERROR;
            }
        }
    }

    return result;
}